

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cpp
# Opt level: O0

void opt_Parse(char *s)

{
  int iVar1;
  size_t sVar2;
  ulong newDepth_00;
  int *piVar3;
  unsigned_long newDepth;
  char *endptr;
  uint precision;
  int result_1;
  uint local_18;
  int local_14;
  uint padByte;
  int result;
  char *s_local;
  
  _padByte = s;
  switch(*s) {
  case '!':
    switch(s[1]) {
    case 'H':
      if (s[2] == '\0') {
        opt_H(true);
      }
      else {
        error("Option \'!H\' does not take an argument\n");
      }
      break;
    default:
      error("Unknown option \'!%c\'\n",(ulong)(uint)(int)s[1]);
      break;
    case 'L':
      if (s[2] == '\0') {
        opt_L(true);
      }
      else {
        error("Option \'!L\' does not take an argument\n");
      }
      break;
    case 'h':
      if (s[2] == '\0') {
        opt_h(true);
      }
      else {
        error("Option \'!h\' does not take an argument\n");
      }
      break;
    case 'l':
      if (s[2] == '\0') {
        opt_l(true);
      }
      else {
        error("Option \'!l\' does not take an argument\n");
      }
    }
    break;
  default:
    error("Unknown option \'%c\'\n",(ulong)(uint)(int)*s);
    break;
  case 'H':
    if (s[1] == '\0') {
      opt_H(false);
    }
    else {
      error("Option \'H\' does not take an argument\n");
    }
    break;
  case 'L':
    if (s[1] == '\0') {
      opt_L(false);
    }
    else {
      error("Option \'L\' does not take an argument\n");
    }
    break;
  case 'Q':
    _precision = s + 1;
    if (*_precision == '.') {
      _precision = s + 2;
    }
    sVar2 = strlen(_precision);
    if (sVar2 < 3) {
      endptr._4_4_ = __isoc99_sscanf(_precision,"%u",&endptr);
      if (endptr._4_4_ == 1) {
        if (((uint)endptr == 0) || (0x1f < (uint)endptr)) {
          error("Argument for option \'Q\' must be between 1 and 31\n");
        }
        else {
          opt_Q((uint8_t)(uint)endptr);
        }
      }
      else {
        error("Invalid argument for option \'Q\'\n");
      }
    }
    else {
      error("Invalid argument for option \'Q\'\n");
    }
    break;
  case 'W':
    sVar2 = strlen(s + 1);
    if (sVar2 == 0) {
      error("Must specify an argument for option \'W\'\n");
    }
    else {
      opt_W(_padByte + 1);
    }
    break;
  case 'b':
    sVar2 = strlen(s + 1);
    if (sVar2 == 2) {
      opt_B(_padByte + 1);
    }
    else {
      error("Must specify exactly 2 characters for option \'b\'\n");
    }
    break;
  case 'g':
    sVar2 = strlen(s + 1);
    if (sVar2 == 4) {
      opt_G(_padByte + 1);
    }
    else {
      error("Must specify exactly 4 characters for option \'g\'\n");
    }
    break;
  case 'h':
    if (s[1] == '\0') {
      opt_h(false);
    }
    else {
      error("Option \'h\' does not take an argument\n");
    }
    break;
  case 'l':
    if (s[1] == '\0') {
      opt_l(false);
    }
    else {
      error("Option \'l\' does not take an argument\n");
    }
    break;
  case 'p':
    sVar2 = strlen(s + 1);
    if (sVar2 < 3) {
      local_14 = __isoc99_sscanf(_padByte + 1,"%x",&local_18);
      if (local_14 == 1) {
        if (local_18 < 0x100) {
          opt_P((uint8_t)local_18);
        }
        else {
          error("Argument for option \'p\' must be between 0 and 0xFF\n");
        }
      }
      else {
        error("Invalid argument for option \'p\'\n");
      }
    }
    else {
      error("Invalid argument for option \'p\'\n");
    }
    break;
  case 'r':
    _padByte = s + 1;
    while (iVar1 = isblank((int)*_padByte), iVar1 != 0) {
      _padByte = _padByte + 1;
    }
    if (*_padByte == '\0') {
      error("Missing argument to option \'r\'\n");
    }
    else {
      newDepth_00 = strtoul(_padByte,(char **)&newDepth,10);
      if (*(char *)newDepth == '\0') {
        piVar3 = __errno_location();
        if (*piVar3 == 0x22) {
          error("Argument to \'r\' is out of range (\"%s\")\n",_padByte);
        }
        else {
          opt_R(newDepth_00);
        }
      }
      else {
        error("Invalid argument to option \'r\' (\"%s\")\n",_padByte);
      }
    }
  }
  return;
}

Assistant:

void opt_Parse(char *s)
{
	switch (s[0]) {
	case 'b':
		if (strlen(&s[1]) == 2)
			opt_B(&s[1]);
		else
			error("Must specify exactly 2 characters for option 'b'\n");
		break;

	case 'g':
		if (strlen(&s[1]) == 4)
			opt_G(&s[1]);
		else
			error("Must specify exactly 4 characters for option 'g'\n");
		break;

	case 'p':
		if (strlen(&s[1]) <= 2) {
			int result;
			unsigned int padByte;

			result = sscanf(&s[1], "%x", &padByte);
			if (result != 1)
				error("Invalid argument for option 'p'\n");
			else if (padByte > 0xFF)
				error("Argument for option 'p' must be between 0 and 0xFF\n");
			else
				opt_P(padByte);
		} else {
			error("Invalid argument for option 'p'\n");
		}
		break;

		const char *precisionArg;
	case 'Q':
		precisionArg = &s[1];
		if (precisionArg[0] == '.')
			precisionArg++;
		if (strlen(precisionArg) <= 2) {
			int result;
			unsigned int precision;

			result = sscanf(precisionArg, "%u", &precision);
			if (result != 1)
				error("Invalid argument for option 'Q'\n");
			else if (precision < 1 || precision > 31)
				error("Argument for option 'Q' must be between 1 and 31\n");
			else
				opt_Q(precision);
		} else {
			error("Invalid argument for option 'Q'\n");
		}
		break;

	case 'r': {
		++s; // Skip 'r'
		while (isblank(*s))
			++s; // Skip leading whitespace

		if (s[0] == '\0') {
			error("Missing argument to option 'r'\n");
			break;
		}

		char *endptr;
		unsigned long newDepth = strtoul(s, &endptr, 10);

		if (*endptr != '\0') {
			error("Invalid argument to option 'r' (\"%s\")\n", s);
		} else if (errno == ERANGE) {
			error("Argument to 'r' is out of range (\"%s\")\n", s);
		} else {
			opt_R(newDepth);
		}
		break;
	}

	case 'H':
		if (s[1] == '\0')
			opt_H(false);
		else
			error("Option 'H' does not take an argument\n");
		break;

	case 'h':
		if (s[1] == '\0')
			opt_h(false);
		else
			error("Option 'h' does not take an argument\n");
		break;

	case 'L':
		if (s[1] == '\0')
			opt_L(false);
		else
			error("Option 'L' does not take an argument\n");
		break;

	case 'l':
		if (s[1] == '\0')
			opt_l(false);
		else
			error("Option 'l' does not take an argument\n");
		break;

	case 'W':
		if (strlen(&s[1]) > 0)
			opt_W(&s[1]);
		else
			error("Must specify an argument for option 'W'\n");
		break;

	case '!': // negates flag options that do not take an argument
		switch (s[1]) {
		case 'H':
			if (s[2] == '\0')
				opt_H(true);
			else
				error("Option '!H' does not take an argument\n");
			break;

		case 'h':
			if (s[2] == '\0')
				opt_h(true);
			else
				error("Option '!h' does not take an argument\n");
			break;

		case 'L':
			if (s[2] == '\0')
				opt_L(true);
			else
				error("Option '!L' does not take an argument\n");
			break;

		case 'l':
			if (s[2] == '\0')
				opt_l(true);
			else
				error("Option '!l' does not take an argument\n");
			break;

		default:
			error("Unknown option '!%c'\n", s[1]);
			break;
		}
		break;

	default:
		error("Unknown option '%c'\n", s[0]);
		break;
	}
}